

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  char *pcVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  byte *pbVar5;
  Location pCVar6;
  long lVar7;
  
  pbVar5 = (byte *)this->current_;
  while (((pbVar5 != (byte *)this->end_ && ((ulong)*pbVar5 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
    pbVar5 = pbVar5 + 1;
    this->current_ = (Location)pbVar5;
  }
  token->start_ = this->current_;
  pbVar5 = (byte *)this->current_;
  if (pbVar5 == (byte *)this->end_) {
    bVar3 = 0;
  }
  else {
    this->current_ = (Location)(pbVar5 + 1);
    bVar3 = *pbVar5;
  }
  bVar4 = false;
  if (0x5a < bVar3) {
    if (bVar3 < 0x6e) {
      if (bVar3 == 0x5b) {
        token->type_ = tokenArrayBegin;
      }
      else {
        if (bVar3 != 0x5d) {
          if (bVar3 != 0x66) goto switchD_0012872b_caseD_23;
          token->type_ = tokenFalse;
          pCVar6 = this->current_;
          if (3 < (long)this->end_ - (long)pCVar6) {
            bVar4 = false;
            lVar7 = 3;
            do {
              if (lVar7 == -1) {
                pCVar6 = pCVar6 + 4;
                goto LAB_00128911;
              }
              pcVar1 = pCVar6 + lVar7;
              lVar2 = lVar7 + 1;
              lVar7 = lVar7 + -1;
            } while (*pcVar1 == "false"[lVar2]);
            goto switchD_0012872b_caseD_23;
          }
          goto LAB_001288b5;
        }
        token->type_ = tokenArrayEnd;
      }
    }
    else {
      if (bVar3 < 0x7b) {
        if (bVar3 == 0x6e) {
          token->type_ = tokenNull;
          pCVar6 = this->current_;
          if (2 < (long)this->end_ - (long)pCVar6) {
            bVar4 = false;
            lVar7 = 2;
            do {
              if (lVar7 == -1) goto LAB_00128907;
              pcVar1 = pCVar6 + lVar7;
              lVar2 = lVar7 + 1;
              lVar7 = lVar7 + -1;
            } while (*pcVar1 == "null"[lVar2]);
            goto switchD_0012872b_caseD_23;
          }
        }
        else {
          if (bVar3 != 0x74) goto switchD_0012872b_caseD_23;
          token->type_ = tokenTrue;
          pCVar6 = this->current_;
          if (2 < (long)this->end_ - (long)pCVar6) {
            bVar4 = false;
            lVar7 = 2;
            do {
              if (lVar7 == -1) goto LAB_00128907;
              pcVar1 = pCVar6 + lVar7;
              lVar2 = lVar7 + 1;
              lVar7 = lVar7 + -1;
            } while (*pcVar1 == "true"[lVar2]);
            goto switchD_0012872b_caseD_23;
          }
        }
LAB_001288b5:
        bVar4 = false;
        goto switchD_0012872b_caseD_23;
      }
      if (bVar3 == 0x7d) {
        token->type_ = tokenObjectEnd;
      }
      else {
        if (bVar3 != 0x7b) goto switchD_0012872b_caseD_23;
        token->type_ = tokenObjectBegin;
      }
    }
    goto LAB_0012873b;
  }
  switch(bVar3) {
  case 0x22:
    token->type_ = tokenString;
    bVar4 = readString(this);
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
    goto switchD_0012872b_caseD_23;
  case 0x2c:
    token->type_ = tokenArraySeparator;
    break;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    token->type_ = tokenNumber;
    readNumber(this);
    break;
  case 0x2f:
    token->type_ = tokenComment;
    bVar4 = readComment(this);
    goto switchD_0012872b_caseD_23;
  case 0x3a:
    token->type_ = tokenMemberSeparator;
    break;
  default:
    if (bVar3 != 0) goto switchD_0012872b_caseD_23;
    token->type_ = tokenEndOfStream;
  }
LAB_0012873b:
  bVar4 = true;
switchD_0012872b_caseD_23:
  if (bVar4 == false) {
    token->type_ = tokenError;
  }
  token->end_ = this->current_;
  return bVar4;
LAB_00128907:
  pCVar6 = pCVar6 + 3;
LAB_00128911:
  this->current_ = pCVar6;
  goto LAB_0012873b;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return ok;
}